

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::EnumOptions::SerializeWithCachedSizesToArray(EnumOptions *this,uint8 *target)

{
  bool bVar1;
  uint value;
  UninterpretedOption *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint8 *puVar3;
  long lVar4;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    bVar1 = this->allow_alias_;
    *target = '\x10';
    target[1] = bVar1;
    target = target + 2;
  }
  if (0 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      this_00 = (UninterpretedOption *)
                (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar4];
      target[0] = 0xba;
      target[1] = '>';
      value = this_00->_cached_size_;
      if (value < 0x80) {
        target[2] = (uint8)value;
        puVar3 = target + 3;
      }
      else {
        puVar3 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 2);
      }
      target = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar3);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  puVar3 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,target);
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar3 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,puVar3);
    return puVar3;
  }
  return puVar3;
}

Assistant:

::google::protobuf::uint8* EnumOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional bool allow_alias = 2 [default = true];
  if (has_allow_alias()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->allow_alias(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}